

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

bool __thiscall QHttpSocketEngine::readHttpHeader(QHttpSocketEngine *this)

{
  long lVar1;
  QHttpNetworkReplyPrivate *pQVar2;
  int iVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool contentLengthOk;
  QArrayData *local_50 [3];
  char local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0x108) == 5) {
    pQVar2 = *(QHttpNetworkReplyPrivate **)(*(long *)(lVar1 + 0x100) + 8);
    if (pQVar2->state == NothingDoneState) {
      QHttpNetworkReplyPrivate::clearHttpLayerInformation(pQVar2);
      *(undefined4 *)(*(long *)(*(long *)(lVar1 + 0x100) + 8) + 0xd0) = 1;
    }
    pQVar2 = *(QHttpNetworkReplyPrivate **)(*(long *)(lVar1 + 0x100) + 8);
    bVar5 = true;
    if (pQVar2->state == ReadingStatusState) {
      qVar4 = QHttpNetworkReplyPrivate::readStatus(pQVar2,*(QIODevice **)(lVar1 + 0xf8));
      bVar5 = qVar4 != -1;
      if ((bVar5) && (bVar5 = true, *(int *)(*(long *)(*(long *)(lVar1 + 0x100) + 8) + 0xd0) == 1))
      goto LAB_00227d2c;
    }
    if ((bVar5) &&
       (pQVar2 = *(QHttpNetworkReplyPrivate **)(*(long *)(lVar1 + 0x100) + 8),
       pQVar2->state == ReadingHeaderState)) {
      qVar4 = QHttpNetworkReplyPrivate::readHeader(pQVar2,*(QIODevice **)(lVar1 + 0xf8));
      bVar5 = qVar4 != -1;
      if ((bVar5) && (bVar5 = true, *(int *)(*(long *)(*(long *)(lVar1 + 0x100) + 8) + 0xd0) == 2))
      goto LAB_00227d2c;
    }
    if (bVar5 != false) {
      local_31 = -0x56;
      (**(code **)(**(long **)(lVar1 + 0x100) + 0x98))
                (local_50,*(long **)(lVar1 + 0x100),0xe,"Content-Length");
      iVar3 = QByteArray::toInt((bool *)local_50,(int)&local_31);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],1,0x10);
        }
      }
      if ((0 < iVar3) && (local_31 != '\0')) {
        *(int *)(lVar1 + 0x120) = iVar3;
      }
      *(undefined4 *)(lVar1 + 0x108) = 4;
    }
  }
  else {
    bVar5 = false;
  }
LAB_00227d2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QHttpSocketEngine::readHttpHeader()
{
    Q_D(QHttpSocketEngine);

    if (d->state != ReadResponseHeader)
        return false;

    bool ok = true;
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::NothingDoneState) {
        // do not keep old content sizes, status etc. around
        d->reply->d_func()->clearHttpLayerInformation();
        d->reply->d_func()->state = QHttpNetworkReplyPrivate::ReadingStatusState;
    }
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState) {
        ok = d->reply->d_func()->readStatus(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState) {
        ok = d->reply->d_func()->readHeader(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok) {
        bool contentLengthOk;
        int contentLength = d->reply->headerField("Content-Length").toInt(&contentLengthOk);
        if (contentLengthOk && contentLength > 0)
            d->pendingResponseData = contentLength;
        d->state = ReadResponseContent; // we are done reading the header
    }
    return ok;
}